

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

int co_cond_signal(stCoCond_t *si)

{
  stCoCondItem_t *psVar1;
  long *plVar2;
  
  psVar1 = co_cond_pop(si);
  if (psVar1 != (stCoCondItem_t *)0x0) {
    RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>(&psVar1->timeout);
    plVar2 = (long *)__tls_get_addr(&PTR_0010afa8);
    AddTail<stTimeoutItem_t,stTimeoutItemLink_t>
              (*(stTimeoutItemLink_t **)(*(long *)(*plVar2 + 0x408) + 0x18),&psVar1->timeout);
  }
  return 0;
}

Assistant:

int co_cond_signal( stCoCond_t *si )
{
	stCoCondItem_t * sp = co_cond_pop( si );
	if( !sp ) 
	{
		return 0;
	}
	RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>( &sp->timeout );

	AddTail( co_get_curr_thread_env()->pEpoll->pstActiveList,&sp->timeout );

	return 0;
}